

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

UBool __thiscall icu_63::UnicodeString::startsWith(UnicodeString *this,UnicodeString *text)

{
  short sVar1;
  int8_t iVar2;
  int32_t thisLength;
  
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    thisLength = (text->fUnion).fFields.fLength;
  }
  else {
    thisLength = (int)sVar1 >> 5;
  }
  iVar2 = doCompare(this,0,thisLength,text,0,thisLength);
  return iVar2 == '\0';
}

Assistant:

inline UBool
UnicodeString::startsWith(const UnicodeString& text) const
{ return compare(0, text.length(), text, 0, text.length()) == 0; }